

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet-proxy.c
# Opt level: O2

void print_buffer(char *buffer,size_t size)

{
  size_t sVar1;
  
  printf("%.*s [",size,buffer);
  for (sVar1 = 0; size != sVar1; sVar1 = sVar1 + 1) {
    printf("<0x%02X>",(ulong)(byte)buffer[sVar1]);
    if (buffer[sVar1] == '\n') {
      putchar(10);
    }
  }
  putchar(0x5d);
  return;
}

Assistant:

static void print_buffer(const char *buffer, size_t size) {
	size_t i;

	printf("%.*s [", (int)size, buffer);
	for (i = 0; i != size; ++i) {
		printf("<" COLOR_BOLD "0x%02X" COLOR_UNBOLD ">", (unsigned char)buffer[i]);
		if(buffer[i] == '\n') printf("%c", '\n');
	}
	printf("]");
}